

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O0

_Bool run_container_is_subset_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *in_RSI;
  int *in_RDI;
  uint32_t j;
  uint32_t le;
  uint32_t run_start;
  int i;
  int32_t card;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined2 uVar6;
  uint16_t in_stack_ffffffffffffffce;
  int in_stack_ffffffffffffffd0;
  int local_20;
  
  if (*in_RSI == -1) {
    iVar3 = bitset_container_compute_cardinality
                      ((bitset_container_t *)
                       CONCAT26(in_stack_ffffffffffffffce,
                                CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
    uVar6 = (undefined2)iVar3;
    in_stack_ffffffffffffffce = (uint16_t)((uint)iVar3 >> 0x10);
    iVar3 = run_container_cardinality
                      ((run_container_t *)
                       CONCAT26(in_stack_ffffffffffffffce,CONCAT24(uVar6,in_stack_ffffffffffffffc8))
                      );
    if (CONCAT22(in_stack_ffffffffffffffce,uVar6) < iVar3) {
      return false;
    }
  }
  else {
    in_stack_ffffffffffffffd0 = *in_RSI;
    iVar3 = run_container_cardinality
                      ((run_container_t *)
                       CONCAT26(in_stack_ffffffffffffffce,
                                CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
    if (in_stack_ffffffffffffffd0 < iVar3) {
      return false;
    }
  }
  local_20 = 0;
  do {
    if (*in_RDI <= local_20) {
      return true;
    }
    uVar1 = *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_20 * 4);
    uVar4 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 4);
    for (uVar5 = uVar4; uVar5 <= uVar4 + uVar1; uVar5 = uVar5 + 1) {
      _Var2 = bitset_container_contains
                        ((bitset_container_t *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffce);
      if (!_Var2) {
        return false;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool run_container_is_subset_bitset(const run_container_t* container1,
                                    const bitset_container_t* container2) {
    // todo: this code could be much faster
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < run_container_cardinality(container1)) {
            return false;
        }
    } else {
        int32_t card = bitset_container_compute_cardinality(
            container2);  // modify container2?
        if (card < run_container_cardinality(container1)) {
            return false;
        }
    }
    for (int i = 0; i < container1->n_runs; ++i) {
        uint32_t run_start = container1->runs[i].value;
        uint32_t le = container1->runs[i].length;
        for (uint32_t j = run_start; j <= run_start + le; ++j) {
            if (!bitset_container_contains(container2, j)) {
                return false;
            }
        }
    }
    return true;
}